

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_torrent.cpp
# Opt level: O1

file_storage * __thiscall
libtorrent::anon_unknown_40::make_file_storage
          (file_storage *__return_storage_ptr__,anon_unknown_40 *this,
          span<const_libtorrent::create_file_entry> files,int piece_size)

{
  int iVar1;
  create_file_entry *f;
  long lVar2;
  
  file_storage::file_storage(__return_storage_ptr__);
  __return_storage_ptr__->m_piece_length = (int)files.m_len;
  if (files.m_ptr != (create_file_entry *)0x0) {
    lVar2 = (long)files.m_ptr * 0x58;
    do {
      file_storage::add_file
                (__return_storage_ptr__,(string *)this,
                 (int64_t)(((string *)((long)this + 0x20))->_M_dataplus)._M_p,
                 (file_flags_t)(uchar)(int)((string *)((long)this + 0x20))->_M_string_length,0,
                 (string_view)ZEXT816(0),(char *)0x0);
      this = (anon_unknown_40 *)((long)&((string *)((long)this + 0x40))->field_2 + 8);
      lVar2 = lVar2 + -0x58;
    } while (lVar2 != 0);
  }
  iVar1 = aux::calc_num_pieces(__return_storage_ptr__);
  __return_storage_ptr__->m_num_pieces = iVar1;
  return __return_storage_ptr__;
}

Assistant:

file_storage make_file_storage(span<create_file_entry const> files, int const piece_size)
	{
		file_storage ret;
		ret.set_piece_length(piece_size);
		for (auto const& f : files)
			ret.add_file(f.filename, f.size, f.flags);
		ret.set_num_pieces(aux::calc_num_pieces(ret));
		return ret;
	}